

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.pb.cc
# Opt level: O2

uint8_t * __thiscall
google::protobuf::Method::_InternalSerialize
          (Method *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  uint8_t *puVar4;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::Option>_> *value;
  int index;
  char *in_R9;
  string *_s;
  undefined8 *puVar5;
  string_view field_name;
  string_view field_name_00;
  string_view field_name_01;
  string_view s;
  string_view s_00;
  string_view s_01;
  
  uVar3 = *(uint *)&this->field_0;
  if ((uVar3 & 1) != 0) {
    puVar5 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    if ((char *)puVar5[1] != (char *)0x0) {
      field_name._M_str = in_R9;
      field_name._M_len = (size_t)"google.protobuf.Method.name";
      internal::WireFormatLite::VerifyUtf8String
                ((WireFormatLite *)*puVar5,(char *)puVar5[1],1,0x1b,field_name);
      s._M_str = (char *)*puVar5;
      s._M_len = puVar5[1];
      target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,1,s,target);
      uVar3 = *(uint *)&this->field_0;
    }
  }
  if ((uVar3 & 2) != 0) {
    puVar5 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.request_type_url_.tagged_ptr_.ptr_ & 0xfffffffffffffffc)
    ;
    if ((char *)puVar5[1] != (char *)0x0) {
      field_name_00._M_str = in_R9;
      field_name_00._M_len = (size_t)"google.protobuf.Method.request_type_url";
      internal::WireFormatLite::VerifyUtf8String
                ((WireFormatLite *)*puVar5,(char *)puVar5[1],1,0x27,field_name_00);
      s_00._M_str = (char *)*puVar5;
      s_00._M_len = puVar5[1];
      target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,2,s_00,target);
      uVar3 = *(uint *)&this->field_0;
    }
  }
  if (((uVar3 & 8) != 0) && ((this->field_0)._impl_.request_streaming_ == true)) {
    puVar4 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = internal::WireFormatLite::WriteBoolToArray
                       (3,(this->field_0)._impl_.request_streaming_,puVar4);
    uVar3 = *(uint *)&this->field_0;
  }
  if ((uVar3 & 4) != 0) {
    puVar5 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.response_type_url_.tagged_ptr_.ptr_ & 0xfffffffffffffffc
             );
    if ((char *)puVar5[1] != (char *)0x0) {
      field_name_01._M_str = in_R9;
      field_name_01._M_len = (size_t)"google.protobuf.Method.response_type_url";
      internal::WireFormatLite::VerifyUtf8String
                ((WireFormatLite *)*puVar5,(char *)puVar5[1],1,0x28,field_name_01);
      s_01._M_str = (char *)*puVar5;
      s_01._M_len = puVar5[1];
      target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,4,s_01,target);
      uVar3 = (this->field_0)._impl_._has_bits_.has_bits_[0];
    }
  }
  if (((uVar3 & 0x10) != 0) && ((this->field_0)._impl_.response_streaming_ == true)) {
    puVar4 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = internal::WireFormatLite::WriteBoolToArray
                       (5,(this->field_0)._impl_.response_streaming_,puVar4);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x10);
  for (index = 0; iVar1 != index; index = index + 1) {
    value = internal::RepeatedPtrFieldBase::
            Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::Option>>
                      (&(this->field_0)._impl_.options_.super_RepeatedPtrFieldBase,index);
    target = internal::WireFormatLite::InternalWriteMessage
                       (6,(MessageLite *)value,(value->field_0)._impl_._cached_size_.atom_,target,
                        stream);
  }
  if (((undefined1  [64])((undefined1  [64])this->field_0 & (undefined1  [64])0x20) !=
       (undefined1  [64])0x0) && ((this->field_0)._impl_.syntax_ != 0)) {
    puVar4 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = internal::WireFormatLite::WriteEnumToArray(7,(this->field_0)._impl_.syntax_,puVar4);
  }
  uVar2 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar2 & 1) == 0) {
    return target;
  }
  puVar4 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((uVar2 & 0xfffffffffffffffe) + 8),target,stream);
  return puVar4;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL Method::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const Method& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.Method)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // string name = 1;
  if ((this_._impl_._has_bits_[0] & 0x00000001u) != 0) {
    if (!this_._internal_name().empty()) {
      const ::std::string& _s = this_._internal_name();
      ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
          _s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "google.protobuf.Method.name");
      target = stream->WriteStringMaybeAliased(1, _s, target);
    }
  }

  // string request_type_url = 2;
  if ((this_._impl_._has_bits_[0] & 0x00000002u) != 0) {
    if (!this_._internal_request_type_url().empty()) {
      const ::std::string& _s = this_._internal_request_type_url();
      ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
          _s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "google.protobuf.Method.request_type_url");
      target = stream->WriteStringMaybeAliased(2, _s, target);
    }
  }

  // bool request_streaming = 3;
  if ((this_._impl_._has_bits_[0] & 0x00000008u) != 0) {
    if (this_._internal_request_streaming() != 0) {
      target = stream->EnsureSpace(target);
      target = ::_pbi::WireFormatLite::WriteBoolToArray(
          3, this_._internal_request_streaming(), target);
    }
  }

  // string response_type_url = 4;
  if ((this_._impl_._has_bits_[0] & 0x00000004u) != 0) {
    if (!this_._internal_response_type_url().empty()) {
      const ::std::string& _s = this_._internal_response_type_url();
      ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
          _s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "google.protobuf.Method.response_type_url");
      target = stream->WriteStringMaybeAliased(4, _s, target);
    }
  }

  // bool response_streaming = 5;
  if ((this_._impl_._has_bits_[0] & 0x00000010u) != 0) {
    if (this_._internal_response_streaming() != 0) {
      target = stream->EnsureSpace(target);
      target = ::_pbi::WireFormatLite::WriteBoolToArray(
          5, this_._internal_response_streaming(), target);
    }
  }

  // repeated .google.protobuf.Option options = 6;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_options_size());
       i < n; i++) {
    const auto& repfield = this_._internal_options().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            6, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // .google.protobuf.Syntax syntax = 7;
  if ((this_._impl_._has_bits_[0] & 0x00000020u) != 0) {
    if (this_._internal_syntax() != 0) {
      target = stream->EnsureSpace(target);
      target = ::_pbi::WireFormatLite::WriteEnumToArray(
          7, this_._internal_syntax(), target);
    }
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.Method)
  return target;
}